

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

void Omega_h::ghost_mesh(Mesh *mesh,Int nlayers,bool verbose)

{
  Int IVar1;
  Int high_dim;
  Dist local_5a8;
  Dist local_518;
  RemoteGraph local_488;
  Dist local_458;
  Dist local_3c8;
  Remotes local_338;
  Dist local_318;
  int local_284;
  undefined1 local_280 [4];
  Int i;
  undefined1 local_260 [8];
  Remotes vert_use_owners;
  RemoteGraph local_1b0;
  undefined1 local_180 [8];
  Dist elems2owners;
  undefined1 local_e0 [8];
  Dist verts2owners;
  RemoteGraph own_verts2own_elems;
  Int nnew_layers;
  bool verbose_local;
  Int nlayers_local;
  Mesh *mesh_local;
  
  IVar1 = Mesh::nghost_layers(mesh);
  if (IVar1 < 0) {
    fail("assertion %s failed at %s +%d\n","mesh->nghost_layers() >= 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
         ,0x67);
  }
  IVar1 = Mesh::nghost_layers(mesh);
  if (IVar1 < nlayers) {
    IVar1 = Mesh::nghost_layers(mesh);
    get_own_verts2own_elems
              ((RemoteGraph *)
               &verts2owners.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,mesh);
    Mesh::ask_dist((Dist *)local_e0,mesh,0);
    RemoteGraph::RemoteGraph
              (&local_1b0,
               (RemoteGraph *)
               &verts2owners.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    Dist::Dist((Dist *)&vert_use_owners.idxs.write_.shared_alloc_.direct_ptr,(Dist *)local_e0);
    close_up((Dist *)local_180,mesh,&local_1b0,
             (Dist *)&vert_use_owners.idxs.write_.shared_alloc_.direct_ptr);
    Dist::~Dist((Dist *)&vert_use_owners.idxs.write_.shared_alloc_.direct_ptr);
    RemoteGraph::~RemoteGraph(&local_1b0);
    Remotes::Remotes((Remotes *)local_260);
    if (1 < nlayers - IVar1) {
      high_dim = Mesh::dim(mesh);
      form_down_use_owners((Remotes *)local_280,mesh,high_dim,0);
      Remotes::operator=((Remotes *)local_260,(Remotes *)local_280);
      Remotes::~Remotes((Remotes *)local_280);
    }
    for (local_284 = 1; local_284 < nlayers - IVar1; local_284 = local_284 + 1) {
      Remotes::Remotes(&local_338,(Remotes *)local_260);
      Dist::Dist(&local_3c8,(Dist *)local_180);
      close_down(&local_318,mesh,&local_338,&local_3c8);
      Dist::operator=((Dist *)local_e0,&local_318);
      Dist::~Dist(&local_318);
      Dist::~Dist(&local_3c8);
      Remotes::~Remotes(&local_338);
      RemoteGraph::RemoteGraph
                (&local_488,
                 (RemoteGraph *)
                 &verts2owners.comm_[1].
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Dist::Dist(&local_518,(Dist *)local_e0);
      close_up(&local_458,mesh,&local_488,&local_518);
      Dist::operator=((Dist *)local_180,&local_458);
      Dist::~Dist(&local_458);
      Dist::~Dist(&local_518);
      RemoteGraph::~RemoteGraph(&local_488);
    }
    Dist::Dist(&local_5a8,(Dist *)local_180);
    migrate_mesh(mesh,&local_5a8,OMEGA_H_GHOSTED,verbose);
    Dist::~Dist(&local_5a8);
    Remotes::~Remotes((Remotes *)local_260);
    Dist::~Dist((Dist *)local_180);
    Dist::~Dist((Dist *)local_e0);
    RemoteGraph::~RemoteGraph
              ((RemoteGraph *)
               &verts2owners.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  fail("assertion %s failed at %s +%d\n","nlayers > mesh->nghost_layers()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
       ,0x68);
}

Assistant:

void ghost_mesh(Mesh* mesh, Int nlayers, bool verbose) {
  OMEGA_H_CHECK(mesh->nghost_layers() >= 0);
  OMEGA_H_CHECK(nlayers > mesh->nghost_layers());
  auto nnew_layers = nlayers - mesh->nghost_layers();
  auto own_verts2own_elems = get_own_verts2own_elems(mesh);
  auto verts2owners = mesh->ask_dist(VERT);
  auto elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  auto vert_use_owners = Remotes();
  if (nnew_layers > 1) {
    vert_use_owners = form_down_use_owners(mesh, mesh->dim(), VERT);
  }
  for (Int i = 1; i < nnew_layers; ++i) {
    verts2owners = close_down(mesh, vert_use_owners, elems2owners);
    elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  }
  migrate_mesh(mesh, elems2owners, OMEGA_H_GHOSTED, verbose);
}